

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

void __thiscall CVmObjFile::check_raw_read(CVmObjFile *this)

{
  CVmObjFile *in_RDI;
  
  check_valid_file(in_RDI);
  check_read_access((CVmObjFile *)0x3380e2);
  check_raw_mode((CVmObjFile *)0x3380ec);
  return;
}

Assistant:

void CVmObjFile::check_raw_read(VMG0_)
{
    check_valid_file(vmg0_);
    check_read_access(vmg0_);
    check_raw_mode(vmg0_);
}